

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::color3d> *value)

{
  bool bVar1;
  double3 v;
  array<double,_3UL> local_28;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<double,3ul>(this,&local_28);
    if (bVar1) {
      *(double *)&value->contained = local_28._M_elems[0];
      *(double *)((long)&value->contained + 8) = local_28._M_elems[1];
      *(double *)((long)&value->contained + 0x10) = local_28._M_elems[2];
      bVar1 = true;
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::color3d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::color3d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}